

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultipoleSum.cpp
# Opt level: O0

void __thiscall
OpenMD::MultipoleSum::MultipoleSum
          (MultipoleSum *this,SimInfo *info,string *filename,string *sele1,RealType rmax,int nrbins)

{
  undefined8 uVar1;
  undefined1 uVar2;
  string *in_RCX;
  undefined8 *in_RDI;
  int in_R8D;
  undefined8 in_XMM0_Qa;
  undefined1 auVar3 [16];
  SimInfo *in_stack_00000168;
  SelectionManager *in_stack_00000170;
  undefined4 in_stack_fffffffffffffeb8;
  uint in_stack_fffffffffffffebc;
  StaticAnalyser *in_stack_fffffffffffffec0;
  SimInfo *in_stack_fffffffffffffec8;
  StaticAnalyser *in_stack_fffffffffffffed0;
  value_type_conflict2 *__x;
  undefined8 *in_stack_fffffffffffffee8;
  undefined7 in_stack_fffffffffffffef0;
  SelectionEvaluator *this_00;
  string *script;
  SelectionEvaluator *this_01;
  string local_80 [32];
  string local_60 [24];
  SimInfo *in_stack_ffffffffffffffb8;
  SelectionEvaluator *in_stack_ffffffffffffffc0;
  
  StaticAnalyser::StaticAnalyser
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,(string *)in_stack_fffffffffffffec0
             ,in_stack_fffffffffffffebc);
  *in_RDI = &PTR__MultipoleSum_0055f948;
  in_RDI[0x19] = (long)in_R8D;
  in_RDI[0x1b] = in_XMM0_Qa;
  script = (string *)(in_RDI + 0x1c);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x17e431);
  this_01 = (SelectionEvaluator *)(in_RDI + 0x1f);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x17e447);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x17e45d);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x17e473);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x17e489);
  std::__cxx11::string::string((string *)(in_RDI + 0x2c),in_RCX);
  SelectionManager::SelectionManager(in_stack_00000170,in_stack_00000168);
  this_00 = (SelectionEvaluator *)(in_RDI + 0x49);
  SelectionEvaluator::SelectionEvaluator(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  getPrefix((string *)in_stack_fffffffffffffec8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffec8,(char *)in_stack_fffffffffffffec0);
  StaticAnalyser::setOutputName
            (in_stack_fffffffffffffec0,
             (string *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_80);
  SelectionEvaluator::loadScriptString(this_01,script);
  uVar2 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0x49));
  if (!(bool)uVar2) {
    in_stack_fffffffffffffee8 = in_RDI + 0x30;
    SelectionEvaluator::evaluate(this_00);
    SelectionManager::setSelectionSet
              ((SelectionManager *)in_stack_fffffffffffffed0,
               (SelectionSet *)in_stack_fffffffffffffec8);
    SelectionSet::~SelectionSet((SelectionSet *)0x17e5d9);
  }
  __x = (value_type_conflict2 *)(in_RDI + 0x1c);
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x17e6c7);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)CONCAT17(uVar2,in_stack_fffffffffffffef0),
             (size_type)in_stack_fffffffffffffee8,__x);
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x17e709);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)CONCAT17(uVar2,in_stack_fffffffffffffef0),
             (size_type)in_stack_fffffffffffffee8,__x);
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x17e74b);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)CONCAT17(uVar2,in_stack_fffffffffffffef0),
             (size_type)in_stack_fffffffffffffee8,__x);
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x17e78d);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)CONCAT17(uVar2,in_stack_fffffffffffffef0),
             (size_type)in_stack_fffffffffffffee8,__x);
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x17e7cf);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)CONCAT17(uVar2,in_stack_fffffffffffffef0),
             (size_type)in_stack_fffffffffffffee8,__x);
  uVar1 = in_RDI[0x19];
  auVar3._8_4_ = (int)((ulong)uVar1 >> 0x20);
  auVar3._0_8_ = uVar1;
  auVar3._12_4_ = 0x45300000;
  in_RDI[0x1a] = (double)in_RDI[0x1b] /
                 ((auVar3._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0));
  return;
}

Assistant:

MultipoleSum::MultipoleSum(SimInfo* info, const std::string& filename,
                             const std::string& sele1, RealType rmax,
                             int nrbins) :
      StaticAnalyser(info, filename, nrbins),
      nRBins_(nrbins), rMax_(rmax), selectionScript1_(sele1), seleMan1_(info),
      evaluator1_(info) {
    setOutputName(getPrefix(filename) + ".multipoleSum");

    evaluator1_.loadScriptString(sele1);
    if (!evaluator1_.isDynamic()) {
      seleMan1_.setSelectionSet(evaluator1_.evaluate());
    }

    aveDlength_.clear();
    aveDlength_.resize(nRBins_, 0.0);
    aveQlength_.clear();
    aveQlength_.resize(nRBins_, 0.0);
    aveDcount_.clear();
    aveDcount_.resize(nRBins_, 0.0);
    aveQcount_.clear();
    aveQcount_.resize(nRBins_, 0.0);
    aveDproj_.clear();
    aveDproj_.resize(nRBins_, 0.0);
    deltaR_ = rMax_ / nRBins_;
  }